

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForthScriptCpp.h
# Opt level: O3

void __thiscall cppforth::Forth::ForthStack<unsigned_int>::pop(ForthStack<unsigned_int> *this)

{
  AbortException *this_00;
  
  if (this->top != 0) {
    this->top = this->top - 1;
    return;
  }
  this_00 = (AbortException *)__cxa_allocate_exception(0x10);
  AbortException::AbortException(this_00,"Forth stack underflow");
  __cxa_throw(this_00,&AbortException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void pop() {
				if (top == 0){
					throw AbortException("Forth stack underflow");
				}
				--top;
			}